

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::MinSampleShadingValueClampingCase::iterate
          (MinSampleShadingValueClampingCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *this_00;
  MessageBuilder local_230;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  MinSampleShadingValueClampingCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_230,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      (&local_230,
                       (char (*) [59])"Verifying clamped values. Value is clamped when specified.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),-0.5);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),-1.0);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),-1.5);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1.5);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),2.0);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),2.5);
  deqp::gls::StateQueryUtil::verifyStateFloat
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c37,1.0,QUERY_FLOAT);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

MinSampleShadingValueClampingCase::IterateResult MinSampleShadingValueClampingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// special values
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying clamped values. Value is clamped when specified." << tcu::TestLog::EndMessage;

		gl.glMinSampleShading(-0.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}